

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_scriptbuilder.cpp
# Opt level: O2

void __thiscall
ScriptBuilder_StringBuildTest_Test::TestBody(ScriptBuilder_StringBuildTest_Test *this)

{
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_00;
  bool bVar1;
  char *pcVar2;
  undefined1 local_100 [56];
  AssertionResult gtest_ar_4;
  AssertHelper local_b8;
  string expect_hex;
  ScriptBuilder sb;
  string expect_asm;
  Script script;
  
  cfd::core::Script::Script(&script);
  sb._vptr_ScriptBuilder = (_func_int **)&PTR__ScriptBuilder_005ba258;
  sb.script_byte_array_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  sb.script_byte_array_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  sb.script_byte_array_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string((string *)local_100,"5",(allocator *)&expect_hex);
  cfd::core::ScriptBuilder::AppendString(&sb,(string *)local_100);
  std::__cxx11::string::~string((string *)local_100);
  std::__cxx11::string::string((string *)local_100,"2",(allocator *)&expect_hex);
  cfd::core::ScriptBuilder::AppendString(&sb,(string *)local_100);
  std::__cxx11::string::~string((string *)local_100);
  std::__cxx11::string::string((string *)local_100,"OP_ADD",(allocator *)&expect_hex);
  cfd::core::ScriptBuilder::AppendString(&sb,(string *)local_100);
  std::__cxx11::string::~string((string *)local_100);
  std::__cxx11::string::string((string *)local_100,"OP_CHECKSIG",(allocator *)&expect_hex);
  cfd::core::ScriptBuilder::AppendString(&sb,(string *)local_100);
  std::__cxx11::string::~string((string *)local_100);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::ScriptBuilder::Build((Script *)local_100,&sb);
      cfd::core::Script::operator=(&script,(Script *)local_100);
      cfd::core::Script::~Script((Script *)local_100);
    }
  }
  else {
    testing::Message::Message((Message *)local_100);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&expect_hex,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_scriptbuilder.cpp"
               ,0xe3,
               "Expected: script = sb.Build() doesn\'t throw an exception.\n  Actual: it throws.");
    testing::internal::AssertHelper::operator=((AssertHelper *)&expect_hex,(Message *)local_100);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&expect_hex);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_100);
  }
  cfd::core::Script::GetHex_abi_cxx11_((string *)local_100,&script);
  testing::internal::CmpHelperSTREQ
            ((internal *)&expect_hex,"script.GetHex().c_str()","\"555293ac\"",
             (char *)local_100._0_8_,"555293ac");
  std::__cxx11::string::~string((string *)local_100);
  if ((char)expect_hex._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)local_100);
    if (expect_hex._M_string_length == 0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)expect_hex._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&expect_asm,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_scriptbuilder.cpp"
               ,0xe4,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&expect_asm,(Message *)local_100);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&expect_asm);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_100);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&expect_hex._M_string_length);
  cfd::core::Script::ToString_abi_cxx11_((string *)local_100,&script);
  testing::internal::CmpHelperSTREQ
            ((internal *)&expect_hex,"script.ToString().c_str()","\"5 2 OP_ADD OP_CHECKSIG\"",
             (char *)local_100._0_8_,"5 2 OP_ADD OP_CHECKSIG");
  std::__cxx11::string::~string((string *)local_100);
  if ((char)expect_hex._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)local_100);
    if (expect_hex._M_string_length == 0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)expect_hex._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&expect_asm,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_scriptbuilder.cpp"
               ,0xe5,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&expect_asm,(Message *)local_100);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&expect_asm);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_100);
  }
  this_00 = &sb.script_byte_array_;
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&expect_hex._M_string_length);
  local_100._0_8_ = &PTR__ScriptBuilder_005ba258;
  local_100._8_8_ = (pointer)0x0;
  local_100._16_8_ = 0;
  local_100._24_8_ = 0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
            (this_00,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)(local_100 + 8));
  cfd::core::ScriptBuilder::~ScriptBuilder((ScriptBuilder *)local_100);
  std::__cxx11::string::string((string *)local_100,"0",(allocator *)&expect_hex);
  cfd::core::ScriptBuilder::AppendString(&sb,(string *)local_100);
  std::__cxx11::string::~string((string *)local_100);
  std::__cxx11::string::string((string *)local_100,"17",(allocator *)&expect_hex);
  cfd::core::ScriptBuilder::AppendString(&sb,(string *)local_100);
  std::__cxx11::string::~string((string *)local_100);
  std::__cxx11::string::string((string *)local_100,"8738",(allocator *)&expect_hex);
  cfd::core::ScriptBuilder::AppendString(&sb,(string *)local_100);
  std::__cxx11::string::~string((string *)local_100);
  std::__cxx11::string::string((string *)local_100,"3355443",(allocator *)&expect_hex);
  cfd::core::ScriptBuilder::AppendString(&sb,(string *)local_100);
  std::__cxx11::string::~string((string *)local_100);
  std::__cxx11::string::string((string *)local_100,"17476",(allocator *)&expect_hex);
  cfd::core::ScriptBuilder::AppendString(&sb,(string *)local_100);
  std::__cxx11::string::~string((string *)local_100);
  std::__cxx11::string::string((string *)local_100,"85",(allocator *)&expect_hex);
  cfd::core::ScriptBuilder::AppendString(&sb,(string *)local_100);
  std::__cxx11::string::~string((string *)local_100);
  std::__cxx11::string::string((string *)local_100,"26214",(allocator *)&expect_hex);
  cfd::core::ScriptBuilder::AppendString(&sb,(string *)local_100);
  std::__cxx11::string::~string((string *)local_100);
  std::__cxx11::string::string((string *)local_100,"7829367",(allocator *)&expect_hex);
  cfd::core::ScriptBuilder::AppendString(&sb,(string *)local_100);
  std::__cxx11::string::~string((string *)local_100);
  std::__cxx11::string::string((string *)local_100,"-2184",(allocator *)&expect_hex);
  cfd::core::ScriptBuilder::AppendString(&sb,(string *)local_100);
  std::__cxx11::string::~string((string *)local_100);
  std::__cxx11::string::string((string *)local_100,"-25",(allocator *)&expect_hex);
  cfd::core::ScriptBuilder::AppendString(&sb,(string *)local_100);
  std::__cxx11::string::~string((string *)local_100);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::ScriptBuilder::Build((Script *)local_100,&sb);
      cfd::core::Script::operator=(&script,(Script *)local_100);
      cfd::core::Script::~Script((Script *)local_100);
    }
  }
  else {
    testing::Message::Message((Message *)local_100);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&expect_hex,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_scriptbuilder.cpp"
               ,0xf3,
               "Expected: script = sb.Build() doesn\'t throw an exception.\n  Actual: it throws.");
    testing::internal::AssertHelper::operator=((AssertHelper *)&expect_hex,(Message *)local_100);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&expect_hex);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_100);
  }
  cfd::core::Script::GetHex_abi_cxx11_((string *)local_100,&script);
  testing::internal::CmpHelperSTREQ
            ((internal *)&expect_hex,"script.GetHex().c_str()",
             "\"000111022222033333330244440155026666037777770288880199\"",(char *)local_100._0_8_,
             "000111022222033333330244440155026666037777770288880199");
  std::__cxx11::string::~string((string *)local_100);
  if ((char)expect_hex._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)local_100);
    if (expect_hex._M_string_length == 0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)expect_hex._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&expect_asm,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_scriptbuilder.cpp"
               ,0xf5,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&expect_asm,(Message *)local_100);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&expect_asm);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_100);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&expect_hex._M_string_length);
  cfd::core::Script::ToString_abi_cxx11_((string *)local_100,&script);
  testing::internal::CmpHelperSTREQ
            ((internal *)&expect_hex,"script.ToString().c_str()",
             "\"0 17 8738 3355443 17476 85 26214 7829367 -2184 -25\"",(char *)local_100._0_8_,
             "0 17 8738 3355443 17476 85 26214 7829367 -2184 -25");
  std::__cxx11::string::~string((string *)local_100);
  if ((char)expect_hex._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)local_100);
    if (expect_hex._M_string_length == 0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)expect_hex._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&expect_asm,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_scriptbuilder.cpp"
               ,0xf7,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&expect_asm,(Message *)local_100);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&expect_asm);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_100);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&expect_hex._M_string_length);
  std::__cxx11::string::string
            ((string *)&expect_hex,
             "46304402203dd0c408e173d6b7252eabc7e3f6a0c632d930a7b343eaf60e7ebee9eb01adcc02204a567cb6a941c88f24f4c4201633468d53810fae9cdb90f35571e6b52bed005e41042322ed12f2779cae32ca89f15d61d10e3bd725d74d45269b05a34abb91b45a2ca19cc8734300deaf74d006871b5cd0730f2384037d16843663a0327fce24aef0029000b1750455529357a820f6116d61351c05df34e116f1cc63fcacbd4f1a3882d2f629e7a0986ac03005c488ac"
             ,(allocator *)local_100);
  std::__cxx11::string::string
            ((string *)&expect_asm,
             "304402203dd0c408e173d6b7252eabc7e3f6a0c632d930a7b343eaf60e7ebee9eb01adcc02204a567cb6a941c88f24f4c4201633468d53810fae9cdb90f35571e6b52bed005e 042322ed12f2779cae32ca89f15d61d10e3bd725d74d45269b05a34abb91b45a2ca19cc8734300deaf74d006871b5cd0730f2384037d16843663a0327fce24aef0 144 OP_CHECKLOCKTIMEVERIFY OP_DROP 1469272661 OP_SHA256 f6116d61351c05df34e116f1cc63fcacbd4f1a3882d2f629e7a0986ac03005c4 OP_EQUALVERIFY OP_CHECKSIG"
             ,(allocator *)local_100);
  local_100._0_8_ = &PTR__ScriptBuilder_005ba258;
  local_100._8_8_ = (pointer)0x0;
  local_100._16_8_ = 0;
  local_100._24_8_ = 0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
            (this_00,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)(local_100 + 8));
  cfd::core::ScriptBuilder::~ScriptBuilder((ScriptBuilder *)local_100);
  std::__cxx11::string::string
            ((string *)local_100,
             "304402203dd0c408e173d6b7252eabc7e3f6a0c632d930a7b343eaf60e7ebee9eb01adcc02204a567cb6a941c88f24f4c4201633468d53810fae9cdb90f35571e6b52bed005e"
             ,(allocator *)&gtest_ar_4);
  cfd::core::ScriptBuilder::AppendString(&sb,(string *)local_100);
  std::__cxx11::string::~string((string *)local_100);
  std::__cxx11::string::string
            ((string *)local_100,
             "042322ed12f2779cae32ca89f15d61d10e3bd725d74d45269b05a34abb91b45a2ca19cc8734300deaf74d006871b5cd0730f2384037d16843663a0327fce24aef0"
             ,(allocator *)&gtest_ar_4);
  cfd::core::ScriptBuilder::AppendString(&sb,(string *)local_100);
  std::__cxx11::string::~string((string *)local_100);
  std::__cxx11::string::string((string *)local_100,"144",(allocator *)&gtest_ar_4);
  cfd::core::ScriptBuilder::AppendString(&sb,(string *)local_100);
  std::__cxx11::string::~string((string *)local_100);
  std::__cxx11::string::string
            ((string *)local_100,"OP_CHECKLOCKTIMEVERIFY",(allocator *)&gtest_ar_4);
  cfd::core::ScriptBuilder::AppendString(&sb,(string *)local_100);
  std::__cxx11::string::~string((string *)local_100);
  std::__cxx11::string::string((string *)local_100,"OP_DROP",(allocator *)&gtest_ar_4);
  cfd::core::ScriptBuilder::AppendString(&sb,(string *)local_100);
  std::__cxx11::string::~string((string *)local_100);
  std::__cxx11::string::string((string *)local_100,"1469272661",(allocator *)&gtest_ar_4);
  cfd::core::ScriptBuilder::AppendString(&sb,(string *)local_100);
  std::__cxx11::string::~string((string *)local_100);
  std::__cxx11::string::string((string *)local_100,"OP_SHA256",(allocator *)&gtest_ar_4);
  cfd::core::ScriptBuilder::AppendString(&sb,(string *)local_100);
  std::__cxx11::string::~string((string *)local_100);
  std::__cxx11::string::string
            ((string *)local_100,"f6116d61351c05df34e116f1cc63fcacbd4f1a3882d2f629e7a0986ac03005c4",
             (allocator *)&gtest_ar_4);
  cfd::core::ScriptBuilder::AppendString(&sb,(string *)local_100);
  std::__cxx11::string::~string((string *)local_100);
  std::__cxx11::string::string((string *)local_100,"OP_EQUALVERIFY",(allocator *)&gtest_ar_4);
  cfd::core::ScriptBuilder::AppendString(&sb,(string *)local_100);
  std::__cxx11::string::~string((string *)local_100);
  std::__cxx11::string::string((string *)local_100,"OP_CHECKSIG",(allocator *)&gtest_ar_4);
  cfd::core::ScriptBuilder::AppendString(&sb,(string *)local_100);
  std::__cxx11::string::~string((string *)local_100);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::ScriptBuilder::Build((Script *)local_100,&sb);
      cfd::core::Script::operator=(&script,(Script *)local_100);
      cfd::core::Script::~Script((Script *)local_100);
    }
  }
  else {
    testing::Message::Message((Message *)local_100);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_scriptbuilder.cpp"
               ,0x109,
               "Expected: script = sb.Build() doesn\'t throw an exception.\n  Actual: it throws.");
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4,(Message *)local_100);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_100);
  }
  cfd::core::Script::GetHex_abi_cxx11_((string *)local_100,&script);
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar_4,"script.GetHex().c_str()","expect_hex.c_str()",
             (char *)local_100._0_8_,
             (char *)CONCAT71(expect_hex._M_dataplus._M_p._1_7_,(char)expect_hex._M_dataplus._M_p));
  std::__cxx11::string::~string((string *)local_100);
  if (gtest_ar_4.success_ == false) {
    testing::Message::Message((Message *)local_100);
    if (gtest_ar_4.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar_4.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_scriptbuilder.cpp"
               ,0x10a,pcVar2);
    testing::internal::AssertHelper::operator=(&local_b8,(Message *)local_100);
    testing::internal::AssertHelper::~AssertHelper(&local_b8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_100);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_4.message_);
  cfd::core::Script::ToString_abi_cxx11_((string *)local_100,&script);
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar_4,"script.ToString().c_str()","expect_asm.c_str()",
             (char *)local_100._0_8_,expect_asm._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)local_100);
  if (gtest_ar_4.success_ == false) {
    testing::Message::Message((Message *)local_100);
    if (gtest_ar_4.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar_4.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_scriptbuilder.cpp"
               ,0x10b,pcVar2);
    testing::internal::AssertHelper::operator=(&local_b8,(Message *)local_100);
    testing::internal::AssertHelper::~AssertHelper(&local_b8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_100);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_4.message_);
  local_100._0_8_ = &PTR__ScriptBuilder_005ba258;
  local_100._8_8_ = (pointer)0x0;
  local_100._16_8_ = 0;
  local_100._24_8_ = 0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
            (this_00,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)(local_100 + 8));
  cfd::core::ScriptBuilder::~ScriptBuilder((ScriptBuilder *)local_100);
  std::__cxx11::string::string((string *)local_100,"0x00",(allocator *)&gtest_ar_4);
  cfd::core::ScriptBuilder::AppendString(&sb,(string *)local_100);
  std::__cxx11::string::~string((string *)local_100);
  std::__cxx11::string::string((string *)local_100,"0x11",(allocator *)&gtest_ar_4);
  cfd::core::ScriptBuilder::AppendString(&sb,(string *)local_100);
  std::__cxx11::string::~string((string *)local_100);
  std::__cxx11::string::string((string *)local_100,"0x2222",(allocator *)&gtest_ar_4);
  cfd::core::ScriptBuilder::AppendString(&sb,(string *)local_100);
  std::__cxx11::string::~string((string *)local_100);
  std::__cxx11::string::string((string *)local_100,"0x333333",(allocator *)&gtest_ar_4);
  cfd::core::ScriptBuilder::AppendString(&sb,(string *)local_100);
  std::__cxx11::string::~string((string *)local_100);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::ScriptBuilder::Build((Script *)local_100,&sb);
      cfd::core::Script::operator=(&script,(Script *)local_100);
      cfd::core::Script::~Script((Script *)local_100);
    }
  }
  else {
    testing::Message::Message((Message *)local_100);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_scriptbuilder.cpp"
               ,0x114,
               "Expected: script = sb.Build() doesn\'t throw an exception.\n  Actual: it throws.");
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4,(Message *)local_100);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_100);
  }
  cfd::core::Script::GetHex_abi_cxx11_((string *)local_100,&script);
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar_4,"script.GetHex().c_str()","\"0100011102222203333333\"",
             (char *)local_100._0_8_,"0100011102222203333333");
  std::__cxx11::string::~string((string *)local_100);
  if (gtest_ar_4.success_ == false) {
    testing::Message::Message((Message *)local_100);
    if (gtest_ar_4.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar_4.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_scriptbuilder.cpp"
               ,0x116,pcVar2);
    testing::internal::AssertHelper::operator=(&local_b8,(Message *)local_100);
    testing::internal::AssertHelper::~AssertHelper(&local_b8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_100);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_4.message_);
  cfd::core::Script::ToString_abi_cxx11_((string *)local_100,&script);
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar_4,"script.ToString().c_str()","\"0 17 8738 3355443\"",
             (char *)local_100._0_8_,"0 17 8738 3355443");
  std::__cxx11::string::~string((string *)local_100);
  if (gtest_ar_4.success_ == false) {
    testing::Message::Message((Message *)local_100);
    if (gtest_ar_4.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar_4.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_scriptbuilder.cpp"
               ,0x118,pcVar2);
    testing::internal::AssertHelper::operator=(&local_b8,(Message *)local_100);
    testing::internal::AssertHelper::~AssertHelper(&local_b8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_100);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_4.message_);
  std::__cxx11::string::~string((string *)&expect_asm);
  std::__cxx11::string::~string((string *)&expect_hex);
  cfd::core::ScriptBuilder::~ScriptBuilder(&sb);
  cfd::core::Script::~Script(&script);
  return;
}

Assistant:

TEST(ScriptBuilder, StringBuildTest) {
  Script script;
  ScriptBuilder sb = ScriptBuilder();
  sb.AppendString("5");
  sb.AppendString("2");
  sb.AppendString("OP_ADD");
  sb.AppendString("OP_CHECKSIG");

  EXPECT_NO_THROW(script = sb.Build());
  EXPECT_STREQ(script.GetHex().c_str(), "555293ac");
  EXPECT_STREQ(script.ToString().c_str(), "5 2 OP_ADD OP_CHECKSIG");

  sb = ScriptBuilder();
  sb.AppendString("0");
  sb.AppendString("17");
  sb.AppendString("8738");
  sb.AppendString("3355443");
  sb.AppendString("17476");
  sb.AppendString("85");
  sb.AppendString("26214");
  sb.AppendString("7829367");
  sb.AppendString("-2184");
  sb.AppendString("-25");

  EXPECT_NO_THROW(script = sb.Build());
  EXPECT_STREQ(script.GetHex().c_str(),
    "000111022222033333330244440155026666037777770288880199");
  EXPECT_STREQ(script.ToString().c_str(),
    "0 17 8738 3355443 17476 85 26214 7829367 -2184 -25");

  std::string expect_hex =
  "46304402203dd0c408e173d6b7252eabc7e3f6a0c632d930a7b343eaf60e7ebee9eb01adcc02204a567cb6a941c88f24f4c4201633468d53810fae9cdb90f35571e6b52bed005e41042322ed12f2779cae32ca89f15d61d10e3bd725d74d45269b05a34abb91b45a2ca19cc8734300deaf74d006871b5cd0730f2384037d16843663a0327fce24aef0029000b1750455529357a820f6116d61351c05df34e116f1cc63fcacbd4f1a3882d2f629e7a0986ac03005c488ac";// NOLINT
  std::string expect_asm =
  "304402203dd0c408e173d6b7252eabc7e3f6a0c632d930a7b343eaf60e7ebee9eb01adcc02204a567cb6a941c88f24f4c4201633468d53810fae9cdb90f35571e6b52bed005e 042322ed12f2779cae32ca89f15d61d10e3bd725d74d45269b05a34abb91b45a2ca19cc8734300deaf74d006871b5cd0730f2384037d16843663a0327fce24aef0 144 OP_CHECKLOCKTIMEVERIFY OP_DROP 1469272661 OP_SHA256 f6116d61351c05df34e116f1cc63fcacbd4f1a3882d2f629e7a0986ac03005c4 OP_EQUALVERIFY OP_CHECKSIG";// NOLINT
  sb = ScriptBuilder();
  sb.AppendString("304402203dd0c408e173d6b7252eabc7e3f6a0c632d930a7b343eaf60e7ebee9eb01adcc02204a567cb6a941c88f24f4c4201633468d53810fae9cdb90f35571e6b52bed005e");
  sb.AppendString("042322ed12f2779cae32ca89f15d61d10e3bd725d74d45269b05a34abb91b45a2ca19cc8734300deaf74d006871b5cd0730f2384037d16843663a0327fce24aef0");
  sb.AppendString("144");
  sb.AppendString("OP_CHECKLOCKTIMEVERIFY");
  sb.AppendString("OP_DROP");
  sb.AppendString("1469272661");
  sb.AppendString("OP_SHA256");
  sb.AppendString("f6116d61351c05df34e116f1cc63fcacbd4f1a3882d2f629e7a0986ac03005c4");
  sb.AppendString("OP_EQUALVERIFY");
  sb.AppendString("OP_CHECKSIG");

  EXPECT_NO_THROW(script = sb.Build());
  EXPECT_STREQ(script.GetHex().c_str(), expect_hex.c_str());
  EXPECT_STREQ(script.ToString().c_str(), expect_asm.c_str());

  // hex test
  sb = ScriptBuilder();
  sb.AppendString("0x00");
  sb.AppendString("0x11");
  sb.AppendString("0x2222");
  sb.AppendString("0x333333");

  EXPECT_NO_THROW(script = sb.Build());
  EXPECT_STREQ(script.GetHex().c_str(),
    "0100011102222203333333");
  EXPECT_STREQ(script.ToString().c_str(),
    "0 17 8738 3355443");
}